

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O1

int lrtr_ipv6_str_to_addr(char *a,lrtr_ipv6_addr *ip)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  lrtr_ipv4_addr addr4;
  uint16_t words [8];
  lrtr_ipv4_addr local_3c;
  undefined4 uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*a == ':') {
    iVar3 = -1;
    if (a[1] != ':') {
LAB_00105807:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return iVar3;
      }
      __stack_chk_fail();
    }
    a = a + 1;
  }
  iVar8 = -1;
  uVar12 = 0;
  pcVar9 = a;
LAB_0010568b:
  while( true ) {
    pcVar9 = pcVar9 + 1;
    iVar10 = (int)uVar12;
    if (*a != ':') {
      if (*a != '\0') {
        iVar6 = 0;
        uVar11 = 0;
        do {
          bVar1 = pcVar9[-1];
          if ((byte)(bVar1 - 0x30) < 10) {
            uVar7 = (uint)(byte)(bVar1 - 0x30);
          }
          else if ((byte)(bVar1 + 0xbf) < 6) {
            uVar7 = bVar1 - 0x37;
          }
          else {
            if (5 < (byte)(bVar1 + 0x9f)) goto LAB_0010570d;
            uVar7 = bVar1 - 0x57;
          }
          iVar6 = iVar6 * 0x10 + uVar7;
          iVar3 = -1;
          if (0xffff < iVar6) goto LAB_00105807;
          pcVar9 = pcVar9 + 1;
          bVar2 = 3 < uVar11;
          uVar11 = uVar11 + 1;
          if (bVar2) goto LAB_00105807;
        } while( true );
      }
      goto LAB_001057a4;
    }
    if (-1 < iVar8) break;
    a = a + 1;
    iVar8 = iVar10;
  }
  iVar3 = -1;
  goto LAB_00105807;
LAB_0010570d:
  iVar3 = -1;
  if ((bVar1 != 0x3a) || (*pcVar9 == '\0')) {
    if ((bVar1 == 0x2e) && ((uVar12 == 6 || (-1 < iVar8 && uVar12 < 6)))) {
      iVar6 = lrtr_ipv4_str_to_addr(a,&local_3c);
      if (iVar6 != -1) {
        *(short *)((long)&uStack_38 + (uVar12 & 0xffffffff) * 2) = (short)(local_3c.addr >> 0x10);
        uVar12 = (ulong)(iVar10 + 2);
        *(short *)((long)&uStack_38 + (ulong)(iVar10 + 1) * 2) = (short)local_3c.addr;
LAB_001057a4:
        if (-1 < iVar8) {
          uVar4 = 7;
          if (iVar8 < (int)uVar12) {
            uVar11 = (int)uVar12 - 1;
            uVar4 = 7;
            do {
              *(undefined2 *)((long)&uStack_38 + uVar4 * 2) =
                   *(undefined2 *)((long)&uStack_38 + (ulong)uVar11 * 2);
              uVar4 = uVar4 - 1;
              uVar11 = uVar11 - 1;
            } while (iVar8 <= (int)uVar11);
          }
          if (iVar8 <= (int)uVar4) {
            do {
              iVar3 = (int)uVar4;
              *(undefined2 *)((long)&uStack_38 + (uVar4 & 0xffffffff) * 2) = 0;
              uVar4 = (ulong)(iVar3 - 1);
            } while (iVar8 < iVar3);
          }
        }
        iVar3 = 0;
        lVar5 = 0;
        do {
          ip->addr[lVar5] =
               (uint)*(ushort *)((long)&uStack_38 + lVar5 * 4 + 2) | (&uStack_38)[lVar5] << 0x10;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
      }
      goto LAB_00105807;
    }
    pcVar9 = pcVar9 + -1;
    if (bVar1 != 0) goto LAB_00105807;
  }
  a = pcVar9;
  if (uVar12 == 8) goto LAB_00105807;
  *(short *)((long)&uStack_38 + uVar12 * 2) = (short)iVar6;
  uVar12 = uVar12 + 1;
  pcVar9 = a;
  goto LAB_0010568b;
}

Assistant:

int lrtr_ipv6_str_to_addr(const char *a, struct lrtr_ipv6_addr *ip)
{
	uint32_t *o = ip->addr;
	uint16_t words[8];
	int i, j, k, l, hfil;
	const char *start;

	if (a[0] == ':') { /* Leading :: */
		if (a[1] != ':')
			return -1;
		a++;
	}
	hfil = -1;
	i = 0;
	while (*a) {
		if (*a == ':') { /* :: */
			if (hfil >= 0)
				return -1;
			hfil = i;
			a++;
			continue;
		}
		j = 0;
		l = 0;
		start = a;
		for (;;) {
			if (*a >= '0' && *a <= '9')
				k = *a++ - '0';
			else if (*a >= 'A' && *a <= 'F')
				k = *a++ - 'A' + 10;
			else if (*a >= 'a' && *a <= 'f')
				k = *a++ - 'a' + 10;
			else
				break;
			j = (j << 4) + k;
			if (j >= 0x10000 || ++l > 4)
				return -1;
		}
		if (*a == ':' && a[1]) {
			a++;
		} else if (*a == '.' && (i == 6 || (i < 6 && hfil >= 0))) { /* Embedded IPv4 address */
			struct lrtr_ipv4_addr addr4;

			if (lrtr_ipv4_str_to_addr(start, &addr4) == -1)
				return -1;
			words[i++] = addr4.addr >> 16;
			words[i++] = addr4.addr;
			break;
		} else if (*a) {
			return -1;
		}
		if (i >= 8)
			return -1;
		words[i++] = j;
	}

	/* Replace :: with an appropriate quantity of zeros */
	if (hfil >= 0) {
		j = 8 - i;
		for (i = 7; i - j >= hfil; i--)
			words[i] = words[i - j];
		for (; i >= hfil; i--)
			words[i] = 0;
	}

	/* Convert the address to lrtr_ip_addr format */
	for (i = 0; i < 4; i++)
		o[i] = (words[2 * i] << 16) | words[2 * i + 1];
	return 0;
}